

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O3

int Smt_PrsBuildConstant(Wlc_Ntk_t *pNtk,char *pStr,int nBits,char *pName)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *vFanins;
  int *__ptr;
  ulong uVar6;
  Vec_Int_t *p;
  int *piVar7;
  Vec_Int_t *p_00;
  ulong uVar8;
  int iVar9;
  size_t sVar10;
  byte *pbVar11;
  byte bVar12;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  int fFound;
  int local_34;
  
  uVar6 = (ulong)(uint)nBits;
  vFanins = (Vec_Int_t *)malloc(0x10);
  vFanins->nCap = 0x10;
  vFanins->nSize = 0;
  __ptr = (int *)malloc(0x40);
  vFanins->pArray = __ptr;
  if (*pStr == '#') {
    if (pStr[1] == 'x') {
      if (nBits == -1) {
        sVar10 = strlen(pStr + 2);
        uVar6 = (ulong)(uint)((int)sVar10 << 2);
      }
      iVar5 = (int)uVar6;
      uVar16 = ((iVar5 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
      if ((int)uVar16 < 0x11) {
        if (0 < (int)uVar16) {
          sVar10 = (ulong)uVar16 << 2;
          goto LAB_0036f8a8;
        }
      }
      else {
        sVar10 = (ulong)uVar16 << 2;
        if (__ptr == (int *)0x0) {
          __ptr = (int *)malloc(sVar10);
        }
        else {
          __ptr = (int *)realloc(__ptr,sVar10);
        }
        vFanins->pArray = __ptr;
        if (__ptr == (int *)0x0) goto LAB_0036fcbd;
        vFanins->nCap = uVar16;
LAB_0036f8a8:
        memset(__ptr,0,sVar10);
      }
      vFanins->nSize = uVar16;
      if (((byte)(pStr[2] - 0x3aU) < 0xf6) && ((byte)((pStr[2] & 0xdfU) + 0xb9) < 0xfa)) {
LAB_0036f972:
        uVar6 = 0;
      }
      else {
        uVar6 = 0;
        do {
          do {
            lVar3 = uVar6 + 3;
            uVar6 = uVar6 + 1;
          } while (0xf5 < (byte)(pStr[lVar3] - 0x3aU));
        } while (0xf9 < (byte)((pStr[lVar3] & 0xdfU) + 0xb9));
        if ((int)uVar6 == 0) goto LAB_0036f972;
        pbVar11 = (byte *)(pStr + (long)(int)uVar6 + 1);
        bVar12 = 0;
        uVar8 = 0;
        do {
          bVar1 = *pbVar11;
          iVar9 = -0x30;
          if (((9 < (byte)(bVar1 - 0x30)) && (iVar9 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
             (iVar9 = -0x57, 5 < (byte)(bVar1 + 0x9f))) goto LAB_0036fc9e;
          *(ulong *)(__ptr + (uVar8 >> 4 & 0xfffffff) * 2) =
               *(ulong *)(__ptr + (uVar8 >> 4 & 0xfffffff) * 2) |
               (ulong)(iVar9 + (uint)bVar1) << (bVar12 & 0x3c);
          uVar8 = uVar8 + 1;
          bVar12 = bVar12 + 4;
          pbVar11 = pbVar11 + -1;
        } while ((uVar6 & 0xffffffff) != uVar8);
      }
      iVar9 = iVar5 + 6;
      if (-1 < iVar5 + 3) {
        iVar9 = iVar5 + 3;
      }
      if ((int)uVar6 != iVar9 >> 2) {
LAB_0036f991:
        if (__ptr != (int *)0x0) {
          free(__ptr);
        }
        free(vFanins);
        return 0;
      }
    }
    else {
      if (pStr[1] != 'b') goto LAB_0036f991;
      if (nBits == -1) {
        uVar6 = strlen(pStr + 2);
      }
      iVar5 = (int)uVar6;
      uVar16 = ((iVar5 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
      if ((int)uVar16 < 0x11) {
        if (0 < (int)uVar16) {
          sVar10 = (ulong)uVar16 << 2;
          goto LAB_0036f822;
        }
      }
      else {
        sVar10 = (ulong)uVar16 << 2;
        if (__ptr == (int *)0x0) {
          __ptr = (int *)malloc(sVar10);
        }
        else {
          __ptr = (int *)realloc(__ptr,sVar10);
        }
        vFanins->pArray = __ptr;
        if (__ptr == (int *)0x0) goto LAB_0036fcbd;
        vFanins->nCap = uVar16;
LAB_0036f822:
        memset(__ptr,0,sVar10);
      }
      vFanins->nSize = uVar16;
      if (0 < iVar5) {
        uVar8 = 0;
        iVar9 = iVar5;
        do {
          iVar9 = iVar9 + -1;
          if (pStr[uVar8 + 2] != '0') {
            if (pStr[uVar8 + 2] != '1') goto LAB_0036f991;
            __ptr[iVar9 >> 5] = __ptr[iVar9 >> 5] | 1 << ((byte)iVar9 & 0x1f);
          }
          uVar8 = uVar8 + 1;
        } while ((uVar6 & 0xffffffff) != uVar8);
      }
    }
  }
  else {
    if (9 < (byte)(*pStr - 0x30U)) {
      iVar5 = Abc_NamStrFindOrAdd(pNtk->pManName,pStr,&local_34);
      if (local_34 == 0) {
        __assert_fail("fFound",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,0x272,"int Smt_PrsBuildConstant(Wlc_Ntk_t *, char *, int, char *)");
      }
      goto joined_r0x0036f662;
    }
    sVar10 = strlen(pStr);
    p = (Vec_Int_t *)malloc(0x10);
    uVar16 = (uint)sVar10;
    uVar4 = 0x10;
    if (0xe < uVar16 - 1) {
      uVar4 = uVar16;
    }
    p->nSize = 0;
    p->nCap = uVar4;
    if (uVar4 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      piVar7 = (int *)malloc((long)(int)uVar4 << 2);
    }
    p->pArray = piVar7;
    if (0 < (int)uVar16) {
      uVar8 = 0;
      do {
        Vec_IntPush(p,pStr[uVar8] + -0x30);
        uVar8 = uVar8 + 1;
      } while ((uVar16 & 0x7fffffff) != uVar8);
    }
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 0x10;
    p_00->nSize = 0;
    piVar7 = (int *)malloc(0x40);
    p_00->pArray = piVar7;
    if ((int)uVar16 < 1) {
      piVar7 = p->pArray;
      uVar16 = 0;
      if (piVar7 != (int *)0x0) goto LAB_0036f7ac;
      free(p);
    }
    else {
      uVar4 = 0;
      iVar5 = 0;
      bVar2 = false;
      do {
        if (((int)uVar4 < 0) || (p->nSize <= (int)uVar4)) goto LAB_0036fc60;
        piVar7 = p->pArray;
        if (piVar7[uVar4] == 0 && iVar5 == 0) {
          uVar4 = uVar4 + 1;
          iVar5 = 0;
          if ((int)uVar16 <= (int)uVar4) {
            iVar5 = 0;
            if (bVar2) goto LAB_0036f789;
            break;
          }
        }
        else {
          iVar9 = piVar7[uVar4] + iVar5 * 10;
          iVar5 = iVar9 % 2;
          piVar7[uVar4] = iVar9 / 2;
          uVar4 = uVar4 + 1;
          bVar2 = true;
          if ((int)uVar16 <= (int)uVar4) {
LAB_0036f789:
            Vec_IntPush(p_00,iVar5);
            bVar2 = false;
            iVar5 = 0;
            uVar4 = 0;
          }
        }
      } while ((int)uVar4 < (int)uVar16);
      uVar16 = p_00->nSize;
LAB_0036f7ac:
      free(piVar7);
      free(p);
      if (uVar16 != 0) goto LAB_0036f9da;
    }
    do {
      Vec_IntPush(p_00,0);
      uVar16 = p_00->nSize;
LAB_0036f9da:
    } while ((uVar16 & 3) != 0);
    uVar4 = (int)uVar16 >> 2;
    pbVar11 = (byte *)malloc((long)(int)(uVar4 + 1));
    if ((int)uVar4 < 1) {
      piVar7 = p_00->pArray;
      pbVar11[(int)uVar4] = 0;
      if (piVar7 != (int *)0x0) goto LAB_0036fad3;
    }
    else {
      uVar8 = (ulong)uVar4;
      uVar13 = (ulong)uVar16;
      pbVar14 = pbVar11 + uVar8;
      uVar15 = 0;
      do {
        pbVar14 = pbVar14 + -1;
        if ((((uVar13 * 4 + 0xc & 0xfffffffffffffff0) == uVar15) ||
            ((uVar13 * 4 + 8 & 0xfffffffffffffff0) == uVar15)) ||
           (((uVar13 * 4 + 4 & 0xfffffffffffffff0) == uVar15 ||
            ((uVar13 * 4 & 0xfffffffffffffff0) == uVar15)))) {
LAB_0036fc60:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar7 = p_00->pArray;
        uVar16 = *(int *)((long)piVar7 + uVar15 + 4) * 2 + *(int *)((long)piVar7 + uVar15) +
                 *(int *)((long)piVar7 + uVar15 + 8) * 4 + *(int *)((long)piVar7 + uVar15 + 0xc) * 8
        ;
        if (0xf < uVar16) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0x23a,"char *Smt_GetHexFromDecimalString(char *)");
        }
        *pbVar14 = (&DAT_009a46a0)[uVar16];
        uVar15 = uVar15 + 0x10;
      } while (uVar8 << 4 != uVar15);
      pbVar11[uVar8] = 0;
LAB_0036fad3:
      free(piVar7);
    }
    free(p_00);
    if (nBits == -1) {
      sVar10 = strlen((char *)pbVar11);
      uVar6 = (ulong)(uint)((int)sVar10 << 2);
    }
    iVar5 = (int)uVar6;
    uVar16 = ((iVar5 >> 5) + 1) - (uint)((uVar6 & 0x1f) == 0);
    if ((int)uVar16 < 0x11) {
      if (0 < (int)uVar16) goto LAB_0036fb4c;
    }
    else {
      sVar10 = (ulong)uVar16 * 4;
      if (__ptr == (int *)0x0) {
        __ptr = (int *)malloc(sVar10);
      }
      else {
        __ptr = (int *)realloc(__ptr,sVar10);
      }
      vFanins->pArray = __ptr;
      if (__ptr == (int *)0x0) {
LAB_0036fcbd:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vFanins->nCap = uVar16;
LAB_0036fb4c:
      memset(__ptr,0,(ulong)uVar16 << 2);
    }
    vFanins->nSize = uVar16;
    if ((0xf5 < (byte)(*pbVar11 - 0x3a)) || (0xf9 < (byte)((*pbVar11 & 0xdf) + 0xb9))) {
      uVar6 = 0;
      do {
        do {
          lVar3 = uVar6 + 1;
          uVar6 = uVar6 + 1;
        } while (0xf5 < (byte)(pbVar11[lVar3] - 0x3a));
      } while (0xf9 < (byte)((pbVar11[lVar3] & 0xdf) + 0xb9));
      if ((int)uVar6 != 0) {
        pbVar14 = pbVar11 + (int)uVar6;
        bVar12 = 0;
        uVar8 = 0;
        do {
          pbVar14 = pbVar14 + -1;
          bVar1 = *pbVar14;
          iVar9 = -0x30;
          if (((9 < (byte)(bVar1 - 0x30)) && (iVar9 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
             (iVar9 = -0x57, 5 < (byte)(bVar1 + 0x9f))) {
LAB_0036fc9e:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x4bf,"int Abc_TtReadHexDigit(char)");
          }
          *(ulong *)(__ptr + (uVar8 >> 4 & 0xfffffff) * 2) =
               *(ulong *)(__ptr + (uVar8 >> 4 & 0xfffffff) * 2) |
               (ulong)(iVar9 + (uint)bVar1) << (bVar12 & 0x3c);
          uVar8 = uVar8 + 1;
          bVar12 = bVar12 + 4;
        } while ((uVar6 & 0xffffffff) != uVar8);
      }
    }
    free(pbVar11);
  }
  iVar5 = Smt_PrsCreateNode(pNtk,6,0,iVar5,vFanins,pName);
  __ptr = vFanins->pArray;
joined_r0x0036f662:
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vFanins);
  return iVar5;
}

Assistant:

static inline int Smt_PrsBuildConstant( Wlc_Ntk_t * pNtk, char * pStr, int nBits, char * pName )
{
    int i, nDigits, iObj;
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    if ( pStr[0] != '#' ) // decimal
    {
        if ( pStr[0] >= '0' && pStr[0] <= '9' )
        {
            // added: sanity check for large constants
            /*
            Vec_Int_t * temp = Vec_IntAlloc(10);
            int fullBits = -1;
            Smt_GetBinaryFromDecimalString(pStr,temp,&fullBits);
            Vec_IntFree(temp);
            assert(fullBits < 32);*/

            char * pHex = Smt_GetHexFromDecimalString(pStr);
            
            if ( nBits == -1 )
                nBits = strlen(pHex)*4;
            
            //printf("nbits: %d\n",nBits);
            
            Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
            nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pHex );
            ABC_FREE( pHex );
            
            /*
            int w, nWords, Number = atoi( pStr );
            if ( nBits == -1 )
            {
                nBits = Abc_Base2Log( Number+1 );
                assert( nBits < 32 );
            }
            nWords = Abc_BitWordNum( nBits );
            for ( w = 0; w < nWords; w++ )
                Vec_IntPush( vFanins, w ? 0 : Number );
            */
        }
        else
        {
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            Vec_IntFree( vFanins );
            return iObj;
        }
    }
    else if ( pStr[1] == 'b' ) // binary
    {
        if ( nBits == -1 )
            nBits = strlen(pStr+2);
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        for ( i = 0; i < nBits; i++ )
            if ( pStr[2+i] == '1' )
                Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), nBits-1-i );
            else if ( pStr[2+i] != '0' )
            {
                Vec_IntFree( vFanins );
                return 0;
            }
    }
    else if ( pStr[1] == 'x' ) // hexadecimal
    {
        if ( nBits == -1 )
            nBits = strlen(pStr+2)*4;
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pStr+2 );
        if ( nDigits != (nBits + 3)/4 )
        {
            Vec_IntFree( vFanins );
            return 0;
        }
    }
    else 
    {
        Vec_IntFree( vFanins );
        return 0;
    }
    // create constant node
    iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_CONST, 0, nBits, vFanins, pName );
    Vec_IntFree( vFanins );
    return iObj;
}